

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Swap_Test::TestBody
          (Proto3ArenaLiteTest_Swap_Test *this)

{
  TestAllTypes *this_00;
  TestAllTypes *other;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Arena arena2;
  Arena arena1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  AssertHelper local_188;
  internal local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  ThreadSafeArena local_170;
  ThreadSafeArena local_c8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c8);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_170);
  this_00 = (TestAllTypes *)
            Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>((Arena *)&local_c8);
  other = (TestAllTypes *)
          Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>((Arena *)&local_170);
  if (other != this_00) {
    uVar1 = (this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    uVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    if (uVar1 == uVar2) {
      proto3_arena_unittest::TestAllTypes::InternalSwap(this_00,other);
    }
    else {
      protobuf::internal::GenericSwap((Message *)this_00,(Message *)other);
    }
  }
  local_188.data_ =
       (AssertHelperData *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_188.data_ & 1) != 0) {
    local_188.data_ = *(AssertHelperData **)((ulong)local_188.data_ & 0xfffffffffffffffe);
  }
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            (local_180,"&arena1","arena1_message->GetArena()",(Arena **)&local_190,
             (Arena **)&local_188);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((ThreadSafeArena *)local_190._M_head_impl != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  local_188.data_ =
       (AssertHelperData *)(other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_188.data_ & 1) != 0) {
    local_188.data_ = *(AssertHelperData **)((ulong)local_188.data_ & 0xfffffffffffffffe);
  }
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            (local_180,"&arena2","arena2_message->GetArena()",(Arena **)&local_190,
             (Arena **)&local_188);
  if (local_180[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_178->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((ThreadSafeArena *)local_190._M_head_impl != (ThreadSafeArena *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,local_178);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_170);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c8);
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Swap) {
  Arena arena1;
  Arena arena2;

  // Test Swap().
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
  arena1_message->Swap(arena2_message);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
}